

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictive_info.c
# Opt level: O0

double * inform_local_predictive_info
                   (int *series,size_t n,size_t m,int b,size_t kpast,size_t kfuture,double *pi,
                   inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  long lVar5;
  void *__ptr;
  int *state_00;
  int *history_00;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong local_118;
  size_t i;
  double f;
  double h;
  double s;
  int *future;
  int *history;
  int *state;
  int *state_data;
  inform_dist futures;
  inform_dist histories;
  inform_dist states;
  uint32_t *histogram_data;
  size_t total_size;
  size_t states_size;
  size_t futures_size;
  size_t histories_size;
  _Bool allocate_pi;
  size_t N;
  size_t kfuture_local;
  size_t kpast_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,kpast,kfuture,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    uVar2 = n * (((m - kpast) - kfuture) + 1);
    bVar6 = pi == (double *)0x0;
    if ((bVar6) && (pi = (double *)malloc(uVar2 * 8), pi == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      auVar8._8_4_ = (int)(kpast >> 0x20);
      auVar8._0_8_ = kpast;
      auVar8._12_4_ = 0x45300000;
      dVar7 = pow((double)b,
                  (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)kpast) - 4503599627370496.0));
      puVar3 = (uint32_t *)
               ((long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f);
      auVar9._8_4_ = (int)(kfuture >> 0x20);
      auVar9._0_8_ = kfuture;
      auVar9._12_4_ = 0x45300000;
      dVar7 = pow((double)b,
                  (auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)kfuture) - 4503599627370496.0));
      puVar4 = (uint32_t *)
               ((long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f);
      lVar5 = (long)puVar3 * (long)puVar4;
      __ptr = calloc((long)(lVar5 + (long)puVar3) + (long)puVar4,4);
      if (__ptr == (void *)0x0) {
        if (bVar6) {
          free(pi);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        futures.counts = (long)__ptr + lVar5 * 4;
        state_data = (int *)((long)__ptr + (long)puVar3 * 4 + lVar5 * 4);
        futures.histogram = puVar4;
        futures.size = uVar2;
        histories.histogram = puVar3;
        histories.size = uVar2;
        histories.counts = (uint64_t)__ptr;
        state_00 = (int *)malloc(uVar2 * 0xc);
        if (state_00 == (int *)0x0) {
          if (bVar6) {
            free(pi);
          }
          free(__ptr);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          series_local = (int *)0x0;
        }
        else {
          history_00 = state_00 + uVar2;
          accumulate_local_observations
                    (series,n,m,b,kpast,kfuture,(inform_dist *)&histories.counts,
                     (inform_dist *)&futures.counts,(inform_dist *)&state_data,state_00,history_00,
                     history_00 + uVar2);
          for (local_118 = 0; local_118 < uVar2; local_118 = local_118 + 1) {
            auVar10._8_4_ = (int)(uVar2 >> 0x20);
            auVar10._0_8_ = uVar2;
            auVar10._12_4_ = 0x45300000;
            dVar7 = log2(((double)*(uint *)(histories.counts + (long)state_00[local_118] * 4) *
                         ((auVar10._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) /
                         ((double)*(uint *)(futures.counts + (long)history_00[local_118] * 4) *
                         (double)(uint)state_data[(history_00 + uVar2)[local_118]]));
            pi[local_118] = dVar7;
          }
          free(state_00);
          free(__ptr);
          series_local = (int *)pi;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_local_predictive_info(int const *series, size_t n, size_t m,
    int b, size_t kpast, size_t kfuture, double *pi, inform_error *err)
{
    if (check_arguments(series, n, m, b, kpast, kfuture, err)) return NULL;

    size_t const N = n * (m - kpast - kfuture + 1);

    bool allocate_pi = (pi == NULL);
    if (allocate_pi)
    {
        pi = malloc(N * sizeof(double));
        if (pi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const histories_size = (size_t) pow((double) b, (double) kpast);
    size_t const futures_size = (size_t) pow((double) b, (double) kfuture);
    size_t const states_size = histories_size * futures_size;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_pi) free(pi);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };
    inform_dist futures   = { histogram_data + states_size + histories_size, futures_size, N };

    int *state_data = malloc(3 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate_pi) free(pi);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state   = state_data;
    int *history = state + N;
    int *future  = history + N;

    accumulate_local_observations(series, n, m, b, kpast, kfuture, &states,
        &histories, &futures, state, history, future);

    double s, h, f;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        h = histories.histogram[history[i]];
        f = futures.histogram[future[i]];
        pi[i] = log2((s * N) / (h * f));
    }

    free(state_data);
    free(histogram_data);

    return pi;
}